

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O1

void __thiscall
xray_re::se_level_changer::state_read(se_level_changer *this,xr_packet *packet,uint16_t size)

{
  undefined8 in_RAX;
  uchar value;
  char local_21;
  
  local_21 = (char)((ulong)in_RAX >> 0x38);
  cse_alife_level_changer::state_read(&this->super_cse_alife_level_changer,packet,size);
  if (0x7a < (this->super_cse_alife_level_changer).super_cse_alife_space_restrictor.
             super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract.m_version) {
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"se_level_changer");
    xr_packet::r_raw(packet,&local_21,1);
    (this->super_cse_alife_level_changer).field_0x199 = local_21 != '\0';
    xr_packet::r_sz(packet,&this->m_hint);
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"se_level_changer");
  }
  return;
}

Assistant:

void se_level_changer::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_level_changer::state_read(packet, size);
	if (m_version >= CSE_VERSION_0x7c_HACK) {
		set_save_marker(packet, SM_LOAD, false, "se_level_changer");
		packet.r_bool(m_enabled);
		packet.r_sz(m_hint);
		set_save_marker(packet, SM_LOAD, true, "se_level_changer");
	}
}